

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O2

void __thiscall flow::Value::Value(Value *this,Value *v)

{
  char buf [256];
  char acStack_118 [256];
  
  this->_vptr_Value = (_func_int **)&PTR__Value_0019c540;
  this->type_ = v->type_;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  snprintf(acStack_118,0x100,"%s_%llu",(v->name_)._M_dataplus._M_p,valueCounter);
  valueCounter = valueCounter + 1;
  std::__cxx11::string::assign((char *)&this->name_);
  return;
}

Assistant:

Value::Value(const Value& v) : type_(v.type_), name_(), uses_() {
  char buf[256];
  snprintf(buf, sizeof(buf), "%s_%llu", v.name().c_str(), valueCounter);
  valueCounter++;
  name_ = buf;
}